

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.h
# Opt level: O3

uint8_t convert_stage2_attrs(CPUARMState_conflict *env,uint8_t s2attrs)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  
  bVar5 = s2attrs & 3;
  bVar2 = 0;
  bVar3 = s2attrs >> 2 & 3;
  if ((s2attrs & 0xc) == 0) {
    bVar1 = 0;
  }
  else {
    if (((env->cp15).hcr_el2 & 0x100000000) == 0) {
      bVar1 = bVar3 << 6;
      bVar4 = (bVar5 != 1) * '\x03';
      bVar2 = 0x30;
      if (bVar3 == 1) {
        bVar2 = 0;
      }
      goto LAB_0061db47;
    }
    bVar5 = 1;
    bVar1 = 0x40;
  }
  bVar4 = 0;
LAB_0061db47:
  return (bVar1 | bVar2) + bVar5 * '\x04' | bVar4;
}

Assistant:

static inline uint32_t extract32(uint32_t value, int start, int length)
{
    assert(start >= 0 && length > 0 && length <= 32 - start);
    return (value >> start) & (~0U >> (32 - length));
}